

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall
LLVMBC::ModuleParseContext::add_instruction(ModuleParseContext *this,Instruction *inst)

{
  pointer *pppIVar1;
  iterator __position;
  BasicBlock *this_00;
  bool bVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  char buffer [4096];
  Instruction *local_1020;
  char local_1018 [4096];
  
  __position._M_current =
       (this->instructions).
       super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1020 = inst;
  if (__position._M_current ==
      (this->instructions).
      super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<LLVMBC::Instruction*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction*>>::
    _M_realloc_insert<LLVMBC::Instruction*const&>
              ((vector<LLVMBC::Instruction*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction*>> *)
               &this->instructions,__position,&local_1020);
  }
  else {
    *__position._M_current = inst;
    pppIVar1 = &(this->instructions).
                super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  this_00 = this->current_bb;
  if (this_00 == (BasicBlock *)0x0) {
    p_Var3 = ::dxil_spv::get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      add_instruction();
    }
    else {
      builtin_strncpy(local_1018,"No basic block is currently set!\n",0x22);
      pvVar4 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,local_1018);
    }
  }
  else {
    BasicBlock::add_instruction(this_00,local_1020);
    bVar2 = Instruction::isTerminator(local_1020);
    if (bVar2) {
      finish_basic_block(this);
    }
    else {
      add_value(this,&local_1020->super_Value);
    }
  }
  return this_00 != (BasicBlock *)0x0;
}

Assistant:

bool ModuleParseContext::add_instruction(Instruction *inst)
{
	instructions.push_back(inst);

	if (current_bb)
		current_bb->add_instruction(inst);
	else
	{
		LOGE("No basic block is currently set!\n");
		return false;
	}

	if (inst->isTerminator())
		return finish_basic_block();
	else
		return add_value(inst);
}